

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.h
# Opt level: O3

bool clickhouse::WireFormat::ReadString(CodedInputStream *input,string *value)

{
  bool bVar1;
  ulong in_RAX;
  uint64_t len;
  ulong local_18;
  
  local_18 = in_RAX;
  bVar1 = CodedInputStream::ReadVarint64(input,&local_18);
  if ((bVar1) && (local_18 < 0x1000000)) {
    std::__cxx11::string::resize((ulong)value,(char)local_18);
    bVar1 = CodedInputStream::ReadRaw(input,(value->_M_dataplus)._M_p,local_18);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool WireFormat::ReadString(
    CodedInputStream* input,
    std::string* value)
{
    uint64_t len;

    if (input->ReadVarint64(&len)) {
        if (len > 0x00FFFFFFULL) {
            return false;
        }
        value->resize((size_t)len);
        return input->ReadRaw(&(*value)[0], (size_t)len);
    }

    return false;
}